

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_ProtoPathNotFoundError_Test::
~CommandLineInterfaceTest_ProtoPathNotFoundError_Test
          (CommandLineInterfaceTest_ProtoPathNotFoundError_Test *this)

{
  CommandLineInterfaceTest_ProtoPathNotFoundError_Test *this_local;
  
  ~CommandLineInterfaceTest_ProtoPathNotFoundError_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ProtoPathNotFoundError) {
  // Test what happens if the input file is not found.

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir/foo foo.proto");

  ExpectErrorText(
      "$tmpdir/foo: warning: directory does not exist.\n"
      "Could not make proto path relative: foo.proto: No such file or "
      "directory\n");
}